

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall
google::protobuf::MapIterator::MapIterator
          (MapIterator *this,MapFieldBase *map,Descriptor *descriptor)

{
  CppType CVar1;
  FieldDescriptor *pFVar2;
  Descriptor *descriptor_local;
  MapFieldBase *map_local;
  MapIterator *this_local;
  
  MapKey::MapKey(&this->key_);
  MapValueRef::MapValueRef(&this->value_);
  this->map_ = map;
  pFVar2 = Descriptor::map_key(descriptor);
  CVar1 = FieldDescriptor::cpp_type(pFVar2);
  MapKey::SetType(&this->key_,CVar1);
  pFVar2 = Descriptor::map_value(descriptor);
  CVar1 = FieldDescriptor::cpp_type(pFVar2);
  MapValueConstRef::SetType(&(this->value_).super_MapValueConstRef,CVar1);
  return;
}

Assistant:

MapIterator(internal::MapFieldBase* map, const Descriptor* descriptor) {
    map_ = map;
    key_.SetType(descriptor->map_key()->cpp_type());
    value_.SetType(descriptor->map_value()->cpp_type());
  }